

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *__format;
  size_t local_ba0;
  uchar hash [38];
  mbedtls_ecdsa_context ctx_sign;
  size_t sig_len;
  mbedtls_ecdsa_context ctx_verify;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar sig [512];
  mbedtls_entropy_context entropy;
  
  builtin_memcpy(hash,"This should be the hash of a message.",0x26);
  mbedtls_ecdsa_init(&ctx_sign);
  mbedtls_ecdsa_init(&ctx_verify);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  memset(sig,0,0x200);
  if (argc != 1) {
    puts("usage: ecdsa");
    uVar1 = 1;
    goto LAB_001054a5;
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&entropy);
  uVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"ecdsa",5);
  if (uVar1 == 0) {
    printf(" ok\n  . Generating key pair...");
    fflush(_stdout);
    uVar1 = mbedtls_ecdsa_genkey
                      (&ctx_sign,MBEDTLS_ECP_DP_SECP192R1,mbedtls_ctr_drbg_random,&ctr_drbg);
    if (uVar1 == 0) {
      printf(" ok (key size: %d bits)\n",(ulong)(uint)ctx_sign.grp.pbits);
      iVar2 = mbedtls_ecp_point_write_binary
                        (&ctx_sign.grp,&ctx_sign.Q,0,&local_ba0,(uchar *)&sig_len,300);
      if (iVar2 == 0) {
        dump_buf("  + Public key: ",(uchar *)&sig_len,local_ba0);
      }
      else {
        puts("internal error");
      }
      printf("  . Signing message...");
      fflush(_stdout);
      uVar1 = mbedtls_ecdsa_write_signature
                        (&ctx_sign,MBEDTLS_MD_SHA256,hash,0x26,sig,&sig_len,mbedtls_ctr_drbg_random,
                         &ctr_drbg);
      if (uVar1 == 0) {
        printf(" ok (signature length = %u)\n",(ulong)(uint)sig_len);
        dump_buf("  + Hash: ",hash,0x26);
        dump_buf("  + Signature: ",sig,CONCAT44(sig_len._4_4_,(uint)sig_len));
        printf("  . Preparing verification context...");
        fflush(_stdout);
        uVar1 = mbedtls_ecp_group_copy(&ctx_verify.grp,&ctx_sign.grp);
        if (uVar1 == 0) {
          uVar1 = mbedtls_ecp_copy(&ctx_verify.Q,&ctx_sign.Q);
          if (uVar1 == 0) {
            uVar1 = 0;
            printf(" ok\n  . Verifying signature...");
            fflush(_stdout);
            uVar3 = mbedtls_ecdsa_read_signature
                              (&ctx_verify,hash,0x26,sig,CONCAT44(sig_len._4_4_,(uint)sig_len));
            if (uVar3 == 0) {
              puts(" ok");
            }
            else {
              printf(" failed\n  ! mbedtls_ecdsa_read_signature returned %d\n",(ulong)uVar3);
              uVar1 = uVar3;
            }
            goto LAB_001054a5;
          }
          __format = " failed\n  ! mbedtls_ecp_copy returned %d\n";
        }
        else {
          __format = " failed\n  ! mbedtls_ecp_group_copy returned %d\n";
        }
        goto LAB_0010549c;
      }
    }
    __format = " failed\n  ! mbedtls_ecdsa_genkey returned %d\n";
  }
  else {
    __format = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
  }
LAB_0010549c:
  printf(__format,(ulong)uVar1);
LAB_001054a5:
  mbedtls_ecdsa_free(&ctx_verify);
  mbedtls_ecdsa_free(&ctx_sign);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return uVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;
    mbedtls_ecdsa_context ctx_sign, ctx_verify;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char hash[] = "This should be the hash of a message.";
    unsigned char sig[512];
    size_t sig_len;
    const char *pers = "ecdsa";
    ((void) argv);

    mbedtls_ecdsa_init( &ctx_sign );
    mbedtls_ecdsa_init( &ctx_verify );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    memset(sig, 0, sizeof( sig ) );
    ret = 1;

    if( argc != 1 )
    {
        mbedtls_printf( "usage: ecdsa\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    /*
     * Generate a key pair for signing
     */
    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating key pair..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_genkey( &ctx_sign, ECPARAMS,
                              mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_genkey returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok (key size: %d bits)\n", (int) ctx_sign.grp.pbits );

    dump_pubkey( "  + Public key: ", &ctx_sign );

    /*
     * Sign some message hash
     */
    mbedtls_printf( "  . Signing message..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_write_signature( &ctx_sign, MBEDTLS_MD_SHA256,
                                       hash, sizeof( hash ),
                                       sig, &sig_len,
                                       mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_genkey returned %d\n", ret );
        goto exit;
    }
    mbedtls_printf( " ok (signature length = %u)\n", (unsigned int) sig_len );

    dump_buf( "  + Hash: ", hash, sizeof hash );
    dump_buf( "  + Signature: ", sig, sig_len );

    /*
     * Transfer public information to verifying context
     *
     * We could use the same context for verification and signatures, but we
     * chose to use a new one in order to make it clear that the verifying
     * context only needs the public key (Q), and not the private key (d).
     */
    mbedtls_printf( "  . Preparing verification context..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecp_group_copy( &ctx_verify.grp, &ctx_sign.grp ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_copy returned %d\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_ecp_copy( &ctx_verify.Q, &ctx_sign.Q ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_copy returned %d\n", ret );
        goto exit;
    }

    ret = 0;

    /*
     * Verify signature
     */
    mbedtls_printf( " ok\n  . Verifying signature..." );
    fflush( stdout );

    if( ( ret = mbedtls_ecdsa_read_signature( &ctx_verify,
                                      hash, sizeof( hash ),
                                      sig, sig_len ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdsa_read_signature returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

exit:

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    mbedtls_ecdsa_free( &ctx_verify );
    mbedtls_ecdsa_free( &ctx_sign );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret );
}